

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O2

void testing::internal::ParseGoogleTestFlagsOnly(int *argc,char **argv)

{
  int iVar1;
  _Alloc_hider str;
  bool bVar2;
  char **in_RDX;
  char **extraout_RDX;
  string *str_00;
  int iVar3;
  long lVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_70;
  string sStack_50;
  long lVar5;
  
  bStack_70._M_dataplus._M_p = (pointer)&bStack_70.field_2;
  bStack_70._M_string_length = 0;
  bStack_70.field_2._M_local_buf[0] = '\0';
  iVar3 = 1;
  str_00 = (string *)argc;
  do {
    if (*argc <= iVar3) {
      if (g_help_flag != '\0') {
        PrintColorEncoded((char *)str_00);
      }
      std::__cxx11::string::~string((string *)&bStack_70);
      return;
    }
    StreamableToString<char*>(&sStack_50,(internal *)(argv + iVar3),in_RDX);
    str._M_p = sStack_50._M_dataplus._M_p;
    bVar2 = ParseGoogleTestFlag(sStack_50._M_dataplus._M_p);
    if (bVar2) {
LAB_003b0a69:
      iVar1 = *argc;
      lVar5 = (long)iVar3;
      while (lVar4 = lVar5 + 1, lVar4 < iVar1) {
        argv[lVar5] = argv[lVar4];
        lVar5 = lVar4;
      }
      *argc = iVar1 + -1;
      argv[(long)iVar1 + -1] = (char *)0x0;
      iVar3 = iVar3 + -1;
    }
    else {
      bVar2 = ParseFlag<std::__cxx11::string>(str._M_p,"flagfile",&bStack_70);
      if (bVar2) {
        std::__cxx11::string::_M_assign((string *)FLAGS_gtest_flagfile_abi_cxx11_);
        LoadFlagsFromFile(&bStack_70);
        goto LAB_003b0a69;
      }
      bVar2 = std::operator==(&sStack_50,"--help");
      if (bVar2) {
LAB_003b0abd:
        g_help_flag = '\x01';
      }
      else {
        bVar2 = HasGoogleTestFlagPrefix((char *)0x3b0ab9);
        if (bVar2) goto LAB_003b0abd;
      }
    }
    str_00 = &sStack_50;
    std::__cxx11::string::~string((string *)&sStack_50);
    iVar3 = iVar3 + 1;
    in_RDX = extraout_RDX;
  } while( true );
}

Assistant:

void ParseGoogleTestFlagsOnly(int* argc, char** argv) {
#ifdef GTEST_HAS_ABSL_FLAGS
  if (*argc <= 0) return;

  std::vector<char*> positional_args;
  std::vector<absl::UnrecognizedFlag> unrecognized_flags;
  absl::ParseAbseilFlagsOnly(*argc, argv, positional_args, unrecognized_flags);
  absl::flat_hash_set<absl::string_view> unrecognized;
  for (const auto& flag : unrecognized_flags) {
    unrecognized.insert(flag.flag_name);
  }
  absl::flat_hash_set<char*> positional;
  for (const auto& arg : positional_args) {
    positional.insert(arg);
  }

  int out_pos = 1;
  int in_pos = 1;
  for (; in_pos < *argc; ++in_pos) {
    char* arg = argv[in_pos];
    absl::string_view arg_str(arg);
    if (absl::ConsumePrefix(&arg_str, "--")) {
      // Flag-like argument. If the flag was unrecognized, keep it.
      // If it was a GoogleTest flag, remove it.
      if (unrecognized.contains(arg_str)) {
        argv[out_pos++] = argv[in_pos];
        continue;
      }
    }

    if (arg_str.empty()) {
      ++in_pos;
      break;  // '--' indicates that the rest of the arguments are positional
    }

    // Probably a positional argument. If it is in fact positional, keep it.
    // If it was a value for the flag argument, remove it.
    if (positional.contains(arg)) {
      argv[out_pos++] = arg;
    }
  }

  // The rest are positional args for sure.
  while (in_pos < *argc) {
    argv[out_pos++] = argv[in_pos++];
  }

  *argc = out_pos;
  argv[out_pos] = nullptr;
#else
  ParseGoogleTestFlagsOnlyImpl(argc, argv);
#endif

  // Fix the value of *_NSGetArgc() on macOS, but if and only if
  // *_NSGetArgv() == argv
  // Only applicable to char** version of argv
#ifdef GTEST_OS_MAC
#ifndef GTEST_OS_IOS
  if (*_NSGetArgv() == argv) {
    *_NSGetArgc() = *argc;
  }
#endif
#endif
}